

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O2

int anon_unknown.dwarf_9f3a5a::FixedVecSize(char *arg)

{
  char cVar1;
  
  do {
    if (arg == (char *)0x0) {
      return 0;
    }
    cVar1 = *arg;
    if (cVar1 == '\0') {
      return 0;
    }
    if (cVar1 == ',') {
      return 0;
    }
    arg = arg + 1;
  } while (9 < (int)cVar1 - 0x30U);
  return (int)cVar1 - 0x30U;
}

Assistant:

int FixedVecSize(const char* arg)
{
    while (!IsEndOfArg(arg)) {
        if (isdigit(*arg))
            return *arg - '0';
        ++arg;
    }

    return 0; // none found.
}